

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbi.cpp
# Opt level: O2

int32_t __thiscall icu_63::RuleBasedBreakIterator::next(RuleBasedBreakIterator *this,int32_t n)

{
  int iVar1;
  
  if (n < 1) {
    if (-1 < n) {
      iVar1 = (*(this->super_BreakIterator).super_UObject._vptr_UObject[0xe])(this);
      return iVar1;
    }
    iVar1 = 0;
    while ((n < 0 && (iVar1 != -1))) {
      iVar1 = (*(this->super_BreakIterator).super_UObject._vptr_UObject[0xc])(this);
      n = n + 1;
    }
  }
  else {
    iVar1 = 0;
    while ((0 < n && (iVar1 != -1))) {
      iVar1 = (*(this->super_BreakIterator).super_UObject._vptr_UObject[0xd])(this);
      n = n + -1;
    }
  }
  return iVar1;
}

Assistant:

int32_t RuleBasedBreakIterator::next(int32_t n) {
    int32_t result = 0;
    if (n > 0) {
        for (; n > 0 && result != UBRK_DONE; --n) {
            result = next();
        }
    } else if (n < 0) {
        for (; n < 0 && result != UBRK_DONE; ++n) {
            result = previous();
        }
    } else {
        result = current();
    }
    return result;
}